

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall TasGrid::GridGlobal::loadGpuNodes<double>(GridGlobal *this)

{
  pointer *__return_storage_ptr__;
  AccelerationContext *pAVar1;
  value_type_conflict3 vVar2;
  bool bVar3;
  int iVar4;
  pointer pCVar5;
  vector<double,_std::allocator<double>_> *__x;
  vector<int,_std::allocator<int>_> *cpu_data;
  const_reference pvVar6;
  size_type __n;
  const_iterator cVar7;
  const_iterator cVar8;
  iterator iVar9;
  size_t __n_00;
  iterator __result;
  reference piVar10;
  const_reference this_00;
  value_type_conflict3 local_1e4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_1e0;
  int i;
  int local_1d4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_1d0;
  int j;
  int local_1c8;
  value_type_conflict3 local_1c4;
  int num_tensor_points;
  int n;
  iterator inump;
  vector<int,_std::allocator<int>_> map_reference;
  vector<int,_std::allocator<int>_> map_index;
  vector<int,_std::allocator<int>_> map_tensor;
  allocator<int> local_141;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> active_num_points;
  allocator<double> local_e9;
  undefined1 local_e8 [8];
  vector<double,_std::allocator<double>_> tweights;
  value_type_conflict3 local_c8;
  int level;
  int dim;
  int num_basis;
  vector<int,_std::allocator<int>_> dim_offsets;
  vector<int,_std::allocator<int>_> map_level;
  vector<int,_std::allocator<int>_> map_dims;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_38;
  unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  local_20;
  unique_ptr *local_18;
  unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  *ccache;
  GridGlobal *this_local;
  
  ccache = (unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            *)this;
  local_18 = (unique_ptr *)getGpuCache<double>(this);
  bVar3 = ::std::unique_ptr::operator_cast_to_bool(local_18);
  if (!bVar3) {
    Utils::make_unique<TasGrid::CudaGlobalData<double>>();
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::operator=((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 *)local_18,&local_20);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::~unique_ptr(&local_20);
  }
  pCVar5 = ::std::
           unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
           ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                         *)local_18);
  bVar3 = GpuVector<double>::empty(&pCVar5->nodes);
  if (bVar3) {
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    bVar3 = OneDimensionalMeta::isNonNested(this->rule);
    if (bVar3) {
      OneDimensionalWrapper::getAllNodes(&local_38,&this->wrapper);
    }
    else {
      __x = OneDimensionalWrapper::getUnique(&this->wrapper);
      ::std::vector<double,_std::allocator<double>_>::vector(&local_38,__x);
    }
    GpuVector<double>::load(&pCVar5->nodes,pAVar1,&local_38);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_38);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    OneDimensionalWrapper::getAllCoeff(&local_60,&this->wrapper);
    GpuVector<double>::load(&pCVar5->coeff,pAVar1,&local_60);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_60);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    cpu_data = OneDimensionalWrapper::getNumNodesPerLevel(&this->wrapper);
    GpuVector<int>::load(&pCVar5->nodes_per_level,pAVar1,cpu_data);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    __return_storage_ptr__ =
         &map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    OneDimensionalWrapper::getOffsetNodesPerLevel
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,&this->wrapper);
    GpuVector<int>::load
              (&pCVar5->offset_per_level,pAVar1,
               (vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&dim);
    level = 0;
    for (local_c8 = 0; iVar4 = level, local_c8 < (this->super_BaseCanonicalGrid).num_dimensions;
        local_c8 = local_c8 + 1) {
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&dim,&level);
      for (tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          iVar4 = tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->max_levels,(long)local_c8), iVar4 <= *pvVar6;
          tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_c8);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict3 *)
                   ((long)&tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
        iVar4 = OneDimensionalWrapper::getNumPoints
                          (&this->wrapper,
                           tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_);
        level = iVar4 + level;
      }
    }
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pCVar5->num_basis = iVar4;
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->map_dimension,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)
               &map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->map_level,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)
               &dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __n = ::std::vector<int,_std::allocator<int>_>::size(&this->active_w);
    ::std::allocator<double>::allocator(&local_e9);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_e8,__n,&local_e9);
    ::std::allocator<double>::~allocator(&local_e9);
    cVar7 = ::std::vector<int,_std::allocator<int>_>::begin(&this->active_w);
    cVar8 = ::std::vector<int,_std::allocator<int>_>::end(&this->active_w);
    iVar9 = ::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_e8);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::GridGlobal::loadGpuNodes<double>()const::_lambda(int)_1_>
              (cVar7._M_current,cVar8._M_current,iVar9._M_current);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<double>::load
              (&pCVar5->tensor_weights,(this->super_BaseCanonicalGrid).acceleration,
               (vector<double,_std::allocator<double>_> *)local_e8);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    cVar7 = MultiIndexSet::begin(&this->active_tensors);
    active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)MultiIndexSet::end(&this->active_tensors);
    GpuVector<int>::
    load<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              (&pCVar5->active_tensors,pAVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar7._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    __n_00 = MultiIndexSet::totalSize(&this->active_tensors);
    ::std::allocator<int>::allocator(&local_141);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_140,__n_00,&local_141);
    ::std::allocator<int>::~allocator(&local_141);
    cVar7 = MultiIndexSet::begin(&this->active_tensors);
    cVar8 = MultiIndexSet::end(&this->active_tensors);
    __result = ::std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_140);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::GridGlobal::loadGpuNodes<double>()const::_lambda(int)_2_>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar7._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __result._M_current,(anon_class_8_1_8991fb9c)this);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->active_num_points,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)local_140);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->dim_offsets,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)&dim);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&inump);
    _num_tensor_points =
         ::std::vector<int,_std::allocator<int>_>::begin
                   ((vector<int,_std::allocator<int>_> *)local_140);
    for (local_1c4 = 0; vVar2 = local_1c4,
        iVar4 = MultiIndexSet::getNumIndexes(&this->active_tensors), vVar2 < iVar4;
        local_1c4 = local_1c4 + 1) {
      _Stack_1d0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &num_tensor_points,0);
      piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&stack0xfffffffffffffe30);
      local_1c8 = *piVar10;
      for (local_1d4 = 1; local_1d4 < (this->super_BaseCanonicalGrid).num_dimensions;
          local_1d4 = local_1d4 + 1) {
        _Stack_1e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&num_tensor_points,0);
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&stack0xfffffffffffffe20);
        local_1c8 = *piVar10 * local_1c8;
      }
      for (local_1e4 = 0; local_1e4 < local_1c8; local_1e4 = local_1e4 + 1) {
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_1c4);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_1e4);
        this_00 = ::std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->tensor_refs,(long)local_1c4);
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_1e4);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&inump,pvVar6);
      }
    }
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->map_tensor,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)
               &map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->map_index,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)
               &map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pCVar5 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    GpuVector<int>::load
              (&pCVar5->map_reference,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)&inump);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&inump);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_140);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_e8);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&dim);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuNodes() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (!ccache->nodes.empty()) return; // already loaded
    // data for stage 1 (Lagrange caching)
    ccache->nodes.load(acceleration, (OneDimensionalMeta::isNonNested(rule)) ? wrapper.getAllNodes() : wrapper.getUnique());
    ccache->coeff.load(acceleration, wrapper.getAllCoeff());
    ccache->nodes_per_level.load(acceleration, wrapper.getNumNodesPerLevel());
    ccache->offset_per_level.load(acceleration, wrapper.getOffsetNodesPerLevel());

    std::vector<int> map_dims, map_level, dim_offsets;
    int num_basis = 0;
    for(int dim=0; dim<num_dimensions; dim++){
        dim_offsets.push_back(num_basis);
        for(int level=0; level <= max_levels[dim]; level++){
            map_dims.push_back(dim);
            map_level.push_back(level);
            num_basis += wrapper.getNumPoints(level);
        }
    }
    ccache->num_basis = num_basis;
    ccache->map_dimension.load(acceleration, map_dims);
    ccache->map_level.load(acceleration, map_level);

    std::vector<double> tweights(active_w.size());
    std::transform(active_w.begin(), active_w.end(), tweights.begin(), [](int i)->double{ return static_cast<double>(i); });
    ccache->tensor_weights.load(acceleration, tweights);

    ccache->active_tensors.load(acceleration, active_tensors.begin(), active_tensors.end());

    std::vector<int> active_num_points(active_tensors.totalSize());
    std::transform(active_tensors.begin(), active_tensors.end(), active_num_points.begin(), [&](int i)->int{ return wrapper.getNumPoints(i); });
    ccache->active_num_points.load(acceleration, active_num_points);

    ccache->dim_offsets.load(acceleration, dim_offsets);

    std::vector<int> map_tensor, map_index, map_reference;
    auto inump = active_num_points.begin();
    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        int num_tensor_points = *inump++;
        for(int j=1; j<num_dimensions; j++)
            num_tensor_points *= *inump++;

        for(int i=0; i<num_tensor_points; i++){
            map_tensor.push_back(n);
            map_index.push_back(i);
            map_reference.push_back(tensor_refs[n][i]);
        }
    }
    ccache->map_tensor.load(acceleration, map_tensor);
    ccache->map_index.load(acceleration, map_index);
    ccache->map_reference.load(acceleration, map_reference);
}